

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraceID.h
# Opt level: O0

void __thiscall
jaegertracing::TraceID::print<std::ostream>
          (TraceID *this,basic_ostream<char,_std::char_traits<char>_> *out)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  void *pvVar4;
  basic_ostream<char,_std::char_traits<char>_> *out_local;
  TraceID *this_local;
  
  if (this->_high == 0) {
    _Var2 = std::setw(0x10);
    poVar3 = std::operator<<(out,_Var2);
    _Var1 = std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,_Var1._M_c);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    std::ostream::operator<<(pvVar4,this->_low);
  }
  else {
    _Var2 = std::setw(0x10);
    poVar3 = std::operator<<(out,_Var2);
    _Var1 = std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,_Var1._M_c);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,this->_high);
    _Var2 = std::setw(0x10);
    poVar3 = std::operator<<(poVar3,_Var2);
    _Var1 = std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,_Var1._M_c);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    std::ostream::operator<<(pvVar4,this->_low);
  }
  return;
}

Assistant:

void print(Stream& out) const
    {
        if (_high == 0) {
            out << std::setw(16) << std::setfill('0') << std::hex << _low;
        }
        else {
            out << std::setw(16) << std::setfill('0') << std::hex << _high
                << std::setw(16) << std::setfill('0') << std::hex << _low;
        }
    }